

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c++
# Opt level: O3

MainBuilder * __thiscall
kj::MainBuilder::addSubCommand
          (MainBuilder *this,StringPtr name,
          Function<kj::Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>_()>
          *getSubParser,StringPtr helpText)

{
  bool bVar1;
  Impl *pIVar2;
  RemoveConst<kj::MainBuilder::Impl::Arg> *pRVar3;
  RemoveConst<kj::MainBuilder::Impl::Arg> *pRVar4;
  size_t sVar5;
  pair<std::_Rb_tree_iterator<std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>_>,_bool>
  pVar6;
  Fault f;
  DebugComparison<unsigned_long,_int> _kjCondition;
  StringPtr name_local;
  
  name_local.content.size_ = name.content.size_;
  name_local.content.ptr = name.content.ptr;
  pIVar2 = (this->impl).ptr;
  pRVar3 = (pIVar2->args).builder.pos;
  pRVar4 = (pIVar2->args).builder.ptr;
  _kjCondition.left = ((long)pRVar3 - (long)pRVar4 >> 3) * -0x3333333333333333;
  _kjCondition._8_8_ = _kjCondition._8_8_ & 0xffffffff00000000;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = pRVar3 == pRVar4;
  if (pRVar3 != pRVar4) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&,char_const(&)[50]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/main.c++"
               ,0x156,FAILED,"impl->args.size() == 0",
               "_kjCondition,\"cannot have sub-commands when expecting arguments\"",&_kjCondition,
               (char (*) [50])"cannot have sub-commands when expecting arguments");
    kj::_::Debug::Fault::fatal(&f);
  }
  _kjCondition.left = (unsigned_long)&pIVar2->finalCallback;
  bVar1 = (pIVar2->finalCallback).ptr.isSet;
  _kjCondition._8_8_ = &none;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition._32_8_ = CONCAT71(_kjCondition._33_7_,bVar1) ^ 1;
  if (bVar1 == false) {
    _kjCondition.op.content.ptr = (char *)(getSubParser->impl).disposer;
    _kjCondition.op.content.size_ = (size_t)(getSubParser->impl).ptr;
    (getSubParser->impl).ptr = (Iface *)0x0;
    _kjCondition.left = (unsigned_long)name_local.content.ptr;
    _kjCondition._8_8_ = name_local.content.size_;
    _kjCondition._32_8_ = helpText.content.ptr;
    pVar6 = std::
            _Rb_tree<kj::StringPtr,std::pair<kj::StringPtr_const,kj::MainBuilder::Impl::SubCommand>,std::_Select1st<std::pair<kj::StringPtr_const,kj::MainBuilder::Impl::SubCommand>>,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,kj::MainBuilder::Impl::SubCommand>>>
            ::_M_emplace_unique<std::pair<kj::StringPtr,kj::MainBuilder::Impl::SubCommand>>
                      ((_Rb_tree<kj::StringPtr,std::pair<kj::StringPtr_const,kj::MainBuilder::Impl::SubCommand>,std::_Select1st<std::pair<kj::StringPtr_const,kj::MainBuilder::Impl::SubCommand>>,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,kj::MainBuilder::Impl::SubCommand>>>
                        *)&pIVar2->subCommands,
                       (pair<kj::StringPtr,_kj::MainBuilder::Impl::SubCommand> *)&_kjCondition);
    sVar5 = _kjCondition.op.content.size_;
    f.exception._0_1_ = pVar6.second;
    if (_kjCondition.op.content.size_ != 0) {
      _kjCondition.op.content.size_ = 0;
      (*(code *)**(undefined8 **)_kjCondition.op.content.ptr)
                (_kjCondition.op.content.ptr,sVar5 + *(long *)(*(long *)sVar5 + -0x10));
    }
    if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      return this;
    }
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[22],kj::StringPtr&>
              ((Fault *)&_kjCondition,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/main.c++"
               ,0x15c,FAILED,
               "impl->subCommands.insert(std::make_pair( name, Impl::SubCommand { kj::mv(getSubParser), helpText })).second"
               ,"_kjCondition,\"duplicate sub-command\", name",(DebugExpression<bool> *)&f,
               (char (*) [22])"duplicate sub-command",&name_local);
    kj::_::Debug::Fault::fatal((Fault *)&_kjCondition);
  }
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<kj::Maybe<kj::Function<kj::MainBuilder::Validity()>>&,kj::None_const&>&,char_const(&)[57]>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/main.c++"
             ,0x158,FAILED,"impl->finalCallback == kj::none",
             "_kjCondition,\"cannot have a final callback when accepting sub-commands\"",
             (DebugComparison<kj::Maybe<kj::Function<kj::MainBuilder::Validity_()>_>_&,_const_kj::None_&>
              *)&_kjCondition,
             (char (*) [57])"cannot have a final callback when accepting sub-commands");
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

MainBuilder& MainBuilder::addSubCommand(StringPtr name, Function<MainFunc()> getSubParser,
                                        StringPtr helpText) {
  KJ_REQUIRE(impl->args.size() == 0, "cannot have sub-commands when expecting arguments");
  KJ_REQUIRE(impl->finalCallback == kj::none,
             "cannot have a final callback when accepting sub-commands");
  KJ_REQUIRE(
      impl->subCommands.insert(std::make_pair(
          name, Impl::SubCommand { kj::mv(getSubParser), helpText })).second,
      "duplicate sub-command", name);
  return *this;
}